

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

bool leveldb::CompareIterators(int step,DB *model,DB *db,Snapshot *model_snap,Snapshot *db_snap)

{
  FILE *pFVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char cVar4;
  char cVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  undefined4 extraout_var;
  long *plVar10;
  uint uVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [2] [16];
  undefined1 local_a0 [2] [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [2] [16];
  undefined2 local_40 [4];
  Snapshot *local_38;
  long *plVar9;
  undefined4 extraout_var_00;
  
  local_40[0] = 0x100;
  local_38 = model_snap;
  iVar8 = (*model->_vptr_DB[6])(model,local_40);
  plVar9 = (long *)CONCAT44(extraout_var,iVar8);
  local_38 = db_snap;
  iVar8 = (*db->_vptr_DB[6])(db,local_40);
  plVar10 = (long *)CONCAT44(extraout_var_00,iVar8);
  (**(code **)(*plVar9 + 0x18))(plVar9);
  (**(code **)(*plVar10 + 0x18))(plVar10);
  uVar11 = 0;
  bVar12 = true;
  do {
    if (!bVar12) {
LAB_00125ae1:
      fprintf(_stderr,"%d entries compared: ok=%d\n",(ulong)uVar11,(ulong)bVar12);
      (**(code **)(*plVar9 + 8))(plVar9);
      (**(code **)(*plVar10 + 8))(plVar10);
      return bVar12;
    }
    cVar4 = (**(code **)(*plVar9 + 0x10))(plVar9);
    if (cVar4 == '\0') {
LAB_001259db:
      cVar4 = (**(code **)(*plVar9 + 0x10))(plVar9);
      cVar5 = (**(code **)(*plVar10 + 0x10))(plVar10);
      pFVar1 = _stderr;
      if (cVar4 != cVar5) {
        bVar6 = (**(code **)(*plVar9 + 0x10))(plVar9);
        bVar7 = (**(code **)(*plVar10 + 0x10))(plVar10);
        bVar12 = false;
        fprintf(pFVar1,"step %d: Mismatch at end of iterators: %d vs. %d\n",(ulong)(uint)step,
                (ulong)bVar6,(ulong)bVar7);
      }
      goto LAB_00125ae1;
    }
    cVar4 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (cVar4 == '\0') goto LAB_001259db;
    auVar13 = (**(code **)(*plVar9 + 0x40))(plVar9);
    local_c0[0] = auVar13;
    auVar13 = (**(code **)(*plVar10 + 0x40))(plVar10);
    local_a0[0] = auVar13;
    iVar8 = Slice::compare((Slice *)local_c0,(Slice *)local_a0);
    pFVar1 = _stderr;
    if (iVar8 != 0) {
      local_60[0] = (**(code **)(*plVar9 + 0x40))(plVar9);
      EscapeString_abi_cxx11_((string *)local_c0,(leveldb *)local_60,local_60[0]._8_8_);
      uVar2 = local_c0[0]._0_8_;
      auVar13 = (**(code **)(*plVar10 + 0x40))(plVar10);
      local_d0 = auVar13;
      EscapeString_abi_cxx11_((string *)local_a0,(leveldb *)local_d0,auVar13._8_8_);
      bVar12 = false;
      fprintf(pFVar1,"step %d: Key mismatch: \'%s\' vs. \'%s\'\n",(ulong)(uint)step,uVar2,
              local_a0[0]._0_8_);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      uVar11 = uVar11 + 1;
      goto LAB_00125ae1;
    }
    auVar13 = (**(code **)(*plVar9 + 0x48))(plVar9);
    local_c0[0] = auVar13;
    auVar13 = (**(code **)(*plVar10 + 0x48))(plVar10);
    local_a0[0] = auVar13;
    iVar8 = Slice::compare((Slice *)local_c0,(Slice *)local_a0);
    pFVar1 = _stderr;
    if (iVar8 != 0) {
      auVar13 = (**(code **)(*plVar9 + 0x40))(plVar9);
      local_d0 = auVar13;
      EscapeString_abi_cxx11_((string *)local_c0,(leveldb *)local_d0,auVar13._8_8_);
      uVar2 = local_c0[0]._0_8_;
      auVar13 = (**(code **)(*plVar9 + 0x48))(plVar9);
      local_70 = auVar13;
      EscapeString_abi_cxx11_((string *)local_a0,(leveldb *)local_70,auVar13._8_8_);
      uVar3 = local_a0[0]._0_8_;
      auVar13 = (**(code **)(*plVar9 + 0x48))(plVar9);
      local_80 = auVar13;
      EscapeString_abi_cxx11_((string *)local_60,(leveldb *)local_80,auVar13._8_8_);
      bVar12 = false;
      fprintf(pFVar1,"step %d: Value mismatch for key \'%s\': \'%s\' vs. \'%s\'\n",(ulong)(uint)step
              ,uVar2,uVar3,local_60[0]._0_8_);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    (**(code **)(*plVar9 + 0x30))(plVar9);
    (**(code **)(*plVar10 + 0x30))(plVar10);
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

static bool CompareIterators(int step, DB* model, DB* db,
                             const Snapshot* model_snap,
                             const Snapshot* db_snap) {
  ReadOptions options;
  options.snapshot = model_snap;
  Iterator* miter = model->NewIterator(options);
  options.snapshot = db_snap;
  Iterator* dbiter = db->NewIterator(options);
  bool ok = true;
  int count = 0;
  for (miter->SeekToFirst(), dbiter->SeekToFirst();
       ok && miter->Valid() && dbiter->Valid(); miter->Next(), dbiter->Next()) {
    count++;
    if (miter->key().compare(dbiter->key()) != 0) {
      std::fprintf(stderr, "step %d: Key mismatch: '%s' vs. '%s'\n", step,
                   EscapeString(miter->key()).c_str(),
                   EscapeString(dbiter->key()).c_str());
      ok = false;
      break;
    }

    if (miter->value().compare(dbiter->value()) != 0) {
      std::fprintf(stderr,
                   "step %d: Value mismatch for key '%s': '%s' vs. '%s'\n",
                   step, EscapeString(miter->key()).c_str(),
                   EscapeString(miter->value()).c_str(),
                   EscapeString(miter->value()).c_str());
      ok = false;
    }
  }

  if (ok) {
    if (miter->Valid() != dbiter->Valid()) {
      std::fprintf(stderr, "step %d: Mismatch at end of iterators: %d vs. %d\n",
                   step, miter->Valid(), dbiter->Valid());
      ok = false;
    }
  }
  std::fprintf(stderr, "%d entries compared: ok=%d\n", count, ok);
  delete miter;
  delete dbiter;
  return ok;
}